

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rtreeSearchPointSwap(RtreeCursor *p,int i,int j)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  RtreeNode *pTemp;
  RtreeSearchPoint t;
  RtreeNode *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 0x18);
  uVar2 = *puVar7;
  uVar3 = puVar7[1];
  uVar4 = puVar7[2];
  puVar7 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (long)in_ESI * 0x18);
  puVar8 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (long)in_EDX * 0x18);
  *puVar7 = *puVar8;
  puVar7[1] = puVar8[1];
  puVar7[2] = puVar8[2];
  puVar7 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (long)in_EDX * 0x18);
  *puVar7 = uVar2;
  puVar7[1] = uVar3;
  puVar7[2] = uVar4;
  iVar5 = in_ESI + 1;
  iVar6 = in_EDX + 1;
  if (iVar5 < 5) {
    if (iVar6 < 5) {
      uVar2 = *(undefined8 *)(in_RDI + 0x58 + (long)iVar5 * 8);
      *(undefined8 *)(in_RDI + 0x58 + (long)iVar5 * 8) =
           *(undefined8 *)(in_RDI + 0x58 + (long)iVar6 * 8);
      *(undefined8 *)(in_RDI + 0x58 + (long)iVar6 * 8) = uVar2;
    }
    else {
      nodeRelease((Rtree *)CONCAT44(iVar5,iVar6),in_stack_ffffffffffffffc8);
      *(undefined8 *)(in_RDI + 0x58 + (long)iVar5 * 8) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void rtreeSearchPointSwap(RtreeCursor *p, int i, int j){
  RtreeSearchPoint t = p->aPoint[i];
  assert( i<j );
  p->aPoint[i] = p->aPoint[j];
  p->aPoint[j] = t;
  i++; j++;
  if( i<RTREE_CACHE_SZ ){
    if( j>=RTREE_CACHE_SZ ){
      nodeRelease(RTREE_OF_CURSOR(p), p->aNode[i]);
      p->aNode[i] = 0;
    }else{
      RtreeNode *pTemp = p->aNode[i];
      p->aNode[i] = p->aNode[j];
      p->aNode[j] = pTemp;
    }
  }
}